

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

Status __thiscall CFG::check(CFG *this)

{
  bool bVar1;
  Type TVar2;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *psVar3;
  reference ppCVar4;
  Addr AVar5;
  Addr AVar6;
  unsigned_long_long uVar7;
  BlockData *this_00;
  Data *pDVar8;
  size_type sVar9;
  CfgEdge *pCVar10;
  unsigned_long_long uVar11;
  CfgEdge *edge_4;
  CfgNode *src_2;
  iterator __end3_3;
  iterator __begin3_3;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range3_3;
  CfgEdge *edge_3;
  CfgNode *src_1;
  iterator __end3_2;
  iterator __begin3_2;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range3_2;
  unsigned_long_long preds_count_1;
  CfgEdge *edge_2;
  CfgNode *dst_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range3_1;
  unsigned_long_long succs_count;
  CfgEdge *edge_1;
  CfgNode *src;
  iterator __end3;
  iterator __begin3;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range3;
  unsigned_long_long preds_count;
  BlockData *bdata;
  CfgEdge *edge;
  CfgNode *local_48;
  CfgNode *dst;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *tmp;
  CfgNode *node;
  iterator __end1;
  iterator __begin1;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range1;
  unsigned_long_long leaving;
  CFG *this_local;
  
  this->m_complete = true;
  this->m_status = INVALID;
  __range1 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)0x0;
  if ((this->m_entryNode != (CfgNode *)0x0) &&
     ((this->m_exitNode != (CfgNode *)0x0 || (this->m_haltNode != (CfgNode *)0x0)))) {
    psVar3 = nodes(this);
    __end1 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin(psVar3);
    node = (CfgNode *)
           std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end(psVar3);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&node), bVar1) {
      ppCVar4 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end1);
      tmp = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)*ppCVar4;
      TVar2 = CfgNode::type((CfgNode *)tmp);
      switch(TVar2) {
      case CFG_ENTRY:
        psVar3 = predecessors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 != 0) goto LAB_0010f716;
        dst = (CfgNode *)successors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size
                          ((set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)dst);
        if (sVar9 != 1) goto LAB_0010f716;
        edge = (CfgEdge *)
               std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                         ((set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)dst);
        ppCVar4 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*
                            ((_Rb_tree_const_iterator<CfgNode_*> *)&edge);
        local_48 = *ppCVar4;
        AVar5 = CfgNode::node2addr(local_48);
        AVar6 = addr(this);
        if (AVar5 != AVar6) goto LAB_0010f716;
        pCVar10 = findEdge(this,(CfgNode *)tmp,local_48);
        if (pCVar10 == (CfgEdge *)0x0) {
          __assert_fail("edge != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0xa5,"enum CFG::Status CFG::check()");
        }
        uVar11 = CfgEdge::count(pCVar10);
        uVar7 = execs(this);
        if (uVar11 != uVar7) goto LAB_0010f716;
        break;
      case CFG_BLOCK:
        psVar3 = predecessors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 == 0) goto LAB_0010f716;
        psVar3 = successors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 == 0) goto LAB_0010f716;
        this_00 = (BlockData *)CfgNode::data((CfgNode *)tmp);
        if (this_00 == (BlockData *)0x0) {
          __assert_fail("bdata != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0xb1,"enum CFG::Status CFG::check()");
        }
        bVar1 = CfgNode::BlockData::indirect(this_00);
        if (bVar1) {
          this->m_complete = false;
        }
        __range3 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)0x0;
        psVar3 = predecessors(this,(CfgNode *)tmp);
        __end3 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                           (psVar3);
        src = (CfgNode *)
              std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end(psVar3);
        while (bVar1 = std::operator!=(&__end3,(_Self *)&src), bVar1) {
          ppCVar4 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end3);
          pCVar10 = findEdge(this,*ppCVar4,(CfgNode *)tmp);
          if (pCVar10 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xb8,"enum CFG::Status CFG::check()");
          }
          uVar11 = CfgEdge::count(pCVar10);
          __range3 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)
                     (&(__range3->_M_t)._M_impl.field_0x0 + uVar11);
          std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end3);
        }
        __range3_1 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)0x0;
        psVar3 = successors(this,(CfgNode *)tmp);
        __end3_1 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                             (psVar3);
        dst_1 = (CfgNode *)
                std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end(psVar3);
        while (bVar1 = std::operator!=(&__end3_1,(_Self *)&dst_1), bVar1) {
          ppCVar4 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end3_1);
          pCVar10 = findEdge(this,(CfgNode *)tmp,*ppCVar4);
          if (pCVar10 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xc0,"enum CFG::Status CFG::check()");
          }
          uVar11 = CfgEdge::count(pCVar10);
          __range3_1 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)
                       (&(__range3_1->_M_t)._M_impl.field_0x0 + uVar11);
          std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end3_1);
        }
        if (__range3 != __range3_1) goto LAB_0010f716;
        break;
      case CFG_PHANTOM:
        psVar3 = predecessors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 == 0) goto LAB_0010f716;
        psVar3 = successors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 != 0) goto LAB_0010f716;
        pDVar8 = CfgNode::data((CfgNode *)tmp);
        if (pDVar8 == (Data *)0x0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,0xce,"enum CFG::Status CFG::check()");
        }
        this->m_complete = false;
        __range3_2 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)0x0;
        psVar3 = predecessors(this,(CfgNode *)tmp);
        __end3_2 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                             (psVar3);
        src_1 = (CfgNode *)
                std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end(psVar3);
        while (bVar1 = std::operator!=(&__end3_2,(_Self *)&src_1), bVar1) {
          ppCVar4 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end3_2);
          pCVar10 = findEdge(this,*ppCVar4,(CfgNode *)tmp);
          if (pCVar10 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xd4,"enum CFG::Status CFG::check()");
          }
          uVar11 = CfgEdge::count(pCVar10);
          __range3_2 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)
                       (&(__range3_2->_M_t)._M_impl.field_0x0 + uVar11);
          std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end3_2);
        }
        if (__range3_2 != (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)0x0)
        goto LAB_0010f716;
        break;
      case CFG_EXIT:
      case CFG_HALT:
        psVar3 = predecessors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 == 0) goto LAB_0010f716;
        psVar3 = successors(this,(CfgNode *)tmp);
        sVar9 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::size(psVar3);
        if (sVar9 != 0) goto LAB_0010f716;
        psVar3 = predecessors(this,(CfgNode *)tmp);
        __end3_3 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                             (psVar3);
        src_2 = (CfgNode *)
                std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end(psVar3);
        while (bVar1 = std::operator!=(&__end3_3,(_Self *)&src_2), bVar1) {
          ppCVar4 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end3_3);
          pCVar10 = findEdge(this,*ppCVar4,(CfgNode *)tmp);
          if (pCVar10 == (CfgEdge *)0x0) {
            __assert_fail("edge != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0xe5,"enum CFG::Status CFG::check()");
          }
          uVar11 = CfgEdge::count(pCVar10);
          __range1 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)
                     (&(__range1->_M_t)._M_impl.field_0x0 + uVar11);
          std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end3_3);
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0xec,"enum CFG::Status CFG::check()");
      }
      std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end1);
    }
    psVar3 = (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)execs(this);
    if (__range1 == psVar3) {
      this->m_status = VALID;
    }
  }
LAB_0010f716:
  return this->m_status;
}

Assistant:

enum CFG::Status CFG::check() {
	m_complete = true;
	m_status = CFG::INVALID;
	unsigned long long leaving = 0;

	if (!m_entryNode || (!m_exitNode && !m_haltNode))
		goto out;

	for (CfgNode* node : this->nodes()) {
		switch (node->type()) {
			case CfgNode::CFG_ENTRY: {
				if (this->predecessors(node).size() != 0)
					goto out;

				const std::set<CfgNode*>& tmp = this->successors(node);
				if (tmp.size() != 1)
					goto out;

				CfgNode* dst = *(tmp.begin());
				if (CfgNode::node2addr(dst) != this->addr())
					goto out;

				CfgEdge* edge = this->findEdge(node, dst);
				assert(edge != 0);
				if (edge->count() != this->execs())
					goto out;

				} break;
			case CfgNode::CFG_BLOCK: {
				if (this->predecessors(node).size() == 0 ||
					this->successors(node).size() == 0)
					goto out;

				CfgNode::BlockData* bdata =
					static_cast<CfgNode::BlockData*>(node->data());
				assert(bdata != 0);
				if (bdata->indirect())
					m_complete = false;

				unsigned long long preds_count = 0;
				for (CfgNode* src : this->predecessors(node)) {
					CfgEdge* edge = this->findEdge(src, node);
					assert(edge != 0);

					preds_count += edge->count();
				}

				unsigned long long succs_count = 0;
				for (CfgNode* dst : this->successors(node)) {
					CfgEdge* edge = this->findEdge(node, dst);
					assert(edge != 0);

					succs_count += edge->count();
				}

				if (preds_count != succs_count)
					goto out;

				} break;
			case CfgNode::CFG_PHANTOM: {
				if (this->predecessors(node).size() == 0 ||
					this->successors(node).size() != 0)
					goto out;

				assert(node->data() != 0);
				m_complete = false;

				unsigned long long preds_count = 0;
				for (CfgNode* src : this->predecessors(node)) {
					CfgEdge* edge = this->findEdge(src, node);
					assert(edge != 0);

					preds_count += edge->count();
				}

				if (preds_count != 0)
					goto out;

				} break;
			case CfgNode::CFG_EXIT:
			case CfgNode::CFG_HALT:
				if (this->predecessors(node).size() == 0 ||
					this->successors(node).size() != 0)
					goto out;

				for (CfgNode* src : this->predecessors(node)) {
					CfgEdge* edge = this->findEdge(src, node);
					assert(edge != 0);

					leaving += edge->count();
				}

				break;
			default:
				assert(false);
		}
	}

	if (leaving != this->execs())
		goto out;

	m_status = CFG::VALID;

out:
	return m_status;
}